

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

void upb_Message_SetBaseFieldInt32(upb_Message *msg,upb_MiniTableField *f,int32_t value)

{
  upb_CType uVar1;
  upb_FieldRep uVar2;
  bool bVar3;
  int32_t local_1c;
  upb_MiniTableField *puStack_18;
  int32_t value_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  local_1c = value;
  puStack_18 = f;
  f_local = (upb_MiniTableField *)msg;
  uVar1 = upb_MiniTableField_CType(f);
  bVar3 = true;
  if (uVar1 != kUpb_CType_Int32) {
    uVar1 = upb_MiniTableField_CType(puStack_18);
    bVar3 = uVar1 == kUpb_CType_Enum;
  }
  if (!bVar3) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int32 || upb_MiniTableField_CType(f) == kUpb_CType_Enum"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x273,
                  "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  bVar3 = upb_MiniTableField_IsScalar(puStack_18);
  if (!bVar3) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x274,
                  "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(puStack_18);
  if (uVar2 == kUpb_FieldRep_4Byte) {
    upb_Message_SetBaseField((upb_Message *)f_local,puStack_18,&local_1c);
    return;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x275,
                "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseFieldInt32(struct upb_Message* msg,
                                                  const upb_MiniTableField* f,
                                                  int32_t value) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int32 ||
             upb_MiniTableField_CType(f) == kUpb_CType_Enum);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_4Byte);
  upb_Message_SetBaseField(msg, f, &value);
}